

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::bn_<(dlib::layer_mode)0>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,true,void>>
          (bn_<(dlib::layer_mode)0> *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  tensor *ptVar1;
  longlong lVar2;
  resizable_tensor *means;
  resizable_tensor *dest;
  resizable_tensor *in_RDX;
  tensor *beta;
  long in_RDI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  double decay;
  alias_tensor_instance b;
  alias_tensor_instance g;
  size_t in_stack_00000148;
  tensor *in_stack_00000150;
  alias_tensor *in_stack_00000158;
  tensor *in_stack_fffffffffffffec8;
  tensor *in_stack_fffffffffffffed0;
  tensor *in_stack_fffffffffffffed8;
  resizable_tensor *in_stack_fffffffffffffee0;
  resizable_tensor *in_stack_fffffffffffffee8;
  double in_stack_fffffffffffffef0;
  double averaging_factor;
  double eps;
  
  auVar3 = in_ZMM0._0_16_;
  auVar4 = in_ZMM1._0_16_;
  beta = (tensor *)(in_RDI + 0x98);
  alias_tensor::operator()(in_stack_00000158,in_stack_00000150,in_stack_00000148);
  alias_tensor::size((alias_tensor *)beta);
  alias_tensor::operator()(in_stack_00000158,in_stack_00000150,in_stack_00000148);
  ptVar1 = dimpl::
           subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
           ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
                         *)0x1e08df);
  lVar2 = tensor::num_samples(ptVar1);
  if (lVar2 < 2) {
    ptVar1 = *(tensor **)(in_RDI + 0x3b8);
    dimpl::
    subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
    ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
                  *)0x1e0a88);
    tt::batch_normalize_conv_inference
              (in_stack_fffffffffffffef0,in_RDX,ptVar1,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(tensor *)0x1e0ac1);
  }
  else {
    auVar3 = vcvtusi2sd_avx512f(auVar3,*(undefined8 *)(in_RDI + 0x388));
    auVar4 = vcvtusi2sd_avx512f(auVar4,*(undefined8 *)(in_RDI + 0x388));
    eps = 1.0 - auVar3._0_8_ / (auVar4._0_8_ + 1.0);
    *(long *)(in_RDI + 0x388) = *(long *)(in_RDI + 0x388) + 1;
    if (*(ulong *)(in_RDI + 0x390) < *(ulong *)(in_RDI + 0x388)) {
      *(undefined8 *)(in_RDI + 0x388) = *(undefined8 *)(in_RDI + 0x390);
    }
    averaging_factor = *(double *)(in_RDI + 0x3b8);
    means = (resizable_tensor *)(in_RDI + 0x128);
    dest = (resizable_tensor *)(in_RDI + 600);
    ptVar1 = (tensor *)(in_RDI + 0x2f0);
    dimpl::
    subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
    ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
                  *)0x1e09e7);
    tt::batch_normalize_conv
              (eps,dest,means,in_RDX,averaging_factor,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,ptVar1,beta);
  }
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e0ad2);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e0adf);
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            auto g = gamma(params,0);
            auto b = beta(params,gamma.size());
            if (sub.get_output().num_samples() > 1)
            {
                const double decay = 1.0 - num_updates/(num_updates+1.0);
                ++num_updates;
                if (num_updates > running_stats_window_size)
                    num_updates = running_stats_window_size;

                if (mode == FC_MODE)
                    tt::batch_normalize(eps, output, means, invstds, decay, running_means, running_variances, sub.get_output(), g, b);
                else 
                    tt::batch_normalize_conv(eps, output, means, invstds, decay, running_means, running_variances, sub.get_output(), g, b);
            }
            else // we are running in testing mode so we just linearly scale the input tensor.
            {
                if (mode == FC_MODE)
                    tt::batch_normalize_inference(eps, output, sub.get_output(), g, b, running_means, running_variances);
                else
                    tt::batch_normalize_conv_inference(eps, output, sub.get_output(), g, b, running_means, running_variances);
            }
        }